

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFParser::parse(QPDFParser *this,InputSource *input,string *object_description,QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  undefined1 local_180 [16];
  QPDFParser local_170;
  undefined1 local_c1;
  undefined1 local_c0 [7];
  bool empty;
  Tokenizer tokenizer;
  QPDF *context_local;
  string *object_description_local;
  InputSource *input_local;
  
  tokenizer._144_8_ = context;
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)local_c0);
  local_c1 = 0;
  iVar1 = (*input->_vptr_InputSource[3])();
  make_description((QPDFParser *)local_180,(string *)CONCAT44(extraout_var,iVar1),object_description
                  );
  QPDFParser((QPDFParser *)(local_180 + 0x10),input,
             (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
              *)local_180,object_description,(Tokenizer *)local_c0,(StringDecrypter *)0x0,
             (QPDF *)tokenizer._144_8_,false,0,0,false);
  parse(this,(bool *)(local_180 + 0x10),SUB81(&local_c1,0));
  ~QPDFParser((QPDFParser *)(local_180 + 0x10));
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr((shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                 *)local_180);
  ::qpdf::Tokenizer::~Tokenizer((Tokenizer *)local_c0);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(InputSource& input, std::string const& object_description, QPDF* context)
{
    qpdf::Tokenizer tokenizer;
    bool empty = false;
    return QPDFParser(
               input,
               make_description(input.getName(), object_description),
               object_description,
               tokenizer,
               nullptr,
               context,
               false)
        .parse(empty, false);
}